

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsApp.cpp
# Opt level: O2

void __thiscall helics::apps::App::loadConfigOptions(App *this,AppTextParser *aparser)

{
  undefined1 local_190 [8];
  istringstream sstr;
  
  if ((aparser->configStr)._M_string_length != 0) {
    generateParser((App *)local_190);
    std::__cxx11::istringstream::istringstream
              ((istringstream *)&sstr,(string *)&aparser->configStr,_S_in);
    CLI::App::parse_from_stream((App *)local_190,(istream *)&sstr);
    std::__cxx11::istringstream::~istringstream((istringstream *)&sstr);
    if (local_190 != (undefined1  [8])0x0) {
      (*(*(_func_int ***)local_190)[1])();
    }
  }
  return;
}

Assistant:

void App::loadConfigOptions(AppTextParser& aparser)
{
    const auto& configStr = aparser.configString();
    if (!configStr.empty()) {
        auto app = generateParser();
        std::istringstream sstr(configStr);
        app->parse_from_stream(sstr);
    }
}